

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_binary(amqp_binary value)

{
  LOGGER_LOG p_Var1;
  undefined4 *__ptr;
  void *__dest;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  ulong __size;
  void *ref_counted;
  
  uVar3 = value.length;
  if (uVar3 == 0 || value.bytes != (void *)0x0) {
    __ptr = (undefined4 *)malloc(0x20);
    if (__ptr == (undefined4 *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar4 = "Could not allocate memory for AMQP value";
        iVar2 = 0x3dd;
        goto LAB_00104cee;
      }
    }
    else {
      *__ptr = 1;
      __ptr[2] = 0x10;
      if (uVar3 == 0) {
        *(undefined8 *)(__ptr + 4) = 0;
        __ptr[6] = 0;
        return (AMQP_VALUE)(__ptr + 2);
      }
      __size = value._8_8_ & 0xffffffff;
      __dest = malloc(__size);
      *(void **)(__ptr + 4) = __dest;
      __ptr[6] = uVar3;
      if (__dest != (void *)0x0) {
        memcpy(__dest,value.bytes,__size);
        return (AMQP_VALUE)(__ptr + 2);
      }
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_binary",0x3f1,1,
                  "Could not allocate memory for binary payload of AMQP value");
      }
      free(__ptr);
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar4 = "NULL bytes with non-zero length";
      iVar2 = 0x3d4;
LAB_00104cee:
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_binary",iVar2,1,pcVar4);
      return (AMQP_VALUE)0x0;
    }
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_binary(amqp_binary value)
{
    AMQP_VALUE result;
    if ((value.bytes == NULL) &&
        (value.length > 0))
    {
        /* Codes_SRS_AMQPVALUE_01_129: [If value.data is NULL and value.length is positive then amqpvalue_create_binary shall return NULL.] */
        LogError("NULL bytes with non-zero length");
        result = NULL;
    }
    else
    {
        result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
        if (result == NULL)
        {
            /* Codes_SRS_AMQPVALUE_01_128: [If allocating the AMQP_VALUE fails then amqpvalue_create_binary shall return NULL.] */
            LogError("Could not allocate memory for AMQP value");
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_127: [amqpvalue_create_binary shall return a handle to an AMQP_VALUE that stores a sequence of bytes.] */
            result->type = AMQP_TYPE_BINARY;
            if (value.length > 0)
            {
                result->value.binary_value.bytes = malloc(value.length);
            }
            else
            {
                result->value.binary_value.bytes = NULL;
            }

            result->value.binary_value.length = value.length;

            if ((result->value.binary_value.bytes == NULL) && (value.length > 0))
            {
                /* Codes_SRS_AMQPVALUE_01_128: [If allocating the AMQP_VALUE fails then amqpvalue_create_binary shall return NULL.] */
                LogError("Could not allocate memory for binary payload of AMQP value");
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                if (value.length > 0)
                {
                    (void)memcpy((void*)result->value.binary_value.bytes, value.bytes, value.length);
                }
            }
        }
    }

    return result;
}